

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluContextInfo.hpp
# Opt level: O2

set<int,_std::less<int>,_std::allocator<int>_> * __thiscall
glu::
CachedValue<std::set<int,_std::less<int>,_std::allocator<int>_>,_glu::GetCompressedTextureFormats>::
getValue(CachedValue<std::set<int,_std::less<int>,_std::allocator<int>_>,_glu::GetCompressedTextureFormats>
         *this,RenderContext *context)

{
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_40;
  
  if (this->m_isComputed == false) {
    GetCompressedTextureFormats::operator()
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&local_40,
               (GetCompressedTextureFormats *)context,context);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::operator=
              (&(this->m_value)._M_t,&local_40);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_40);
    this->m_isComputed = true;
  }
  return &this->m_value;
}

Assistant:

const T& getValue (const RenderContext& context) const
	{
		if (!m_isComputed)
		{
			m_value			= m_compute(context);
			m_isComputed	= true;
		}
		return m_value;
	}